

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::SimplePragmaExpressionSyntax::setChild
          (SimplePragmaExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  logic_error *this_00;
  long *plVar6;
  size_type *psVar7;
  long *plVar8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 0) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->value).kind = pvVar5->kind;
    (this->value).field_0x2 = uVar2;
    (this->value).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->value).rawLen = uVar4;
    (this->value).info = pIVar1;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar7) {
    local_d0.field_2._M_allocated_capacity = *psVar7;
    local_d0.field_2._8_8_ = plVar6[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar7;
  }
  local_d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x2e4b);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar6;
  plVar8 = plVar6 + 2;
  if (local_b0 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar6;
  plVar8 = plVar6 + 2;
  if (local_f0 == plVar8) {
    local_e0 = *plVar8;
    lStack_d8 = plVar6[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar8;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void SimplePragmaExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: value = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}